

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscOutboundPacketStream.cpp
# Opt level: O1

OutboundPacketStream * __thiscall
osc::OutboundPacketStream::operator<<(OutboundPacketStream *this,float rhs)

{
  char *pcVar1;
  
  CheckForAvailableArgumentSpace(this,4);
  pcVar1 = this->typeTagsCurrent_;
  this->typeTagsCurrent_ = pcVar1 + -1;
  pcVar1[-1] = 'f';
  this->argumentCurrent_[3] = SUB41(rhs,0);
  this->argumentCurrent_[2] = (char)((uint)rhs >> 8);
  this->argumentCurrent_[1] = (char)((uint)rhs >> 0x10);
  *this->argumentCurrent_ = (char)((uint)rhs >> 0x18);
  this->argumentCurrent_ = this->argumentCurrent_ + 4;
  return this;
}

Assistant:

OutboundPacketStream& OutboundPacketStream::operator<<( float rhs )
{
    CheckForAvailableArgumentSpace(4);

    *(--typeTagsCurrent_) = FLOAT_TYPE_TAG;

#ifdef OSC_HOST_LITTLE_ENDIAN
    union{
        float f;
        char c[4];
    } u;

    u.f = rhs;

    argumentCurrent_[3] = u.c[0];
    argumentCurrent_[2] = u.c[1];
    argumentCurrent_[1] = u.c[2];
    argumentCurrent_[0] = u.c[3];
#else
    *reinterpret_cast<float*>(argumentCurrent_) = rhs;
#endif

    argumentCurrent_ += 4;

    return *this;
}